

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeArrayIndex(ExpressionContext *ctx,SynTypeArray *syntax)

{
  IntrusiveList<SynCallArgument> arguments_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExprBase *pEVar2;
  SynArrayIndex *syntax_00;
  SynBase *el;
  SynBase *value;
  IntrusiveList<SynCallArgument> arguments;
  
  value = (syntax->sizes).head;
  if (value != (SynBase *)0x0) {
    syntax_00 = (SynArrayIndex *)0x0;
    for (; value != (SynBase *)0x0; value = value->next) {
      arguments.head = (SynCallArgument *)0x0;
      arguments.tail = (SynCallArgument *)0x0;
      if (value->typeID != 3) {
        iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        SynCallArgument::SynCallArgument
                  ((SynCallArgument *)CONCAT44(extraout_var,iVar1),value->begin,value->end,
                   (SynIdentifier *)0x0,value);
        IntrusiveList<SynCallArgument>::push_back
                  (&arguments,(SynCallArgument *)CONCAT44(extraout_var,iVar1));
      }
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
      if (syntax_00 == (SynArrayIndex *)0x0) {
        syntax_00 = (SynArrayIndex *)syntax->type;
      }
      arguments_00.tail = arguments.tail;
      arguments_00.head = arguments.head;
      SynArrayIndex::SynArrayIndex
                ((SynArrayIndex *)CONCAT44(extraout_var_00,iVar1),value->begin,value->end,
                 &syntax_00->super_SynBase,arguments_00);
      syntax_00 = (SynArrayIndex *)CONCAT44(extraout_var_00,iVar1);
    }
    pEVar2 = AnalyzeArrayIndex(ctx,syntax_00);
    return pEVar2;
  }
  __assert_fail("syntax->sizes.head",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x159b,"ExprBase *AnalyzeArrayIndex(ExpressionContext &, SynTypeArray *)");
}

Assistant:

ExprBase* AnalyzeArrayIndex(ExpressionContext &ctx, SynTypeArray *syntax)
{
	assert(syntax->sizes.head);

	SynArrayIndex *value = NULL;

	// Convert to a chain of SynArrayIndex
	for(SynBase *el = syntax->sizes.head; el; el = el->next)
	{
		IntrusiveList<SynCallArgument> arguments;

		if(!isType<SynNothing>(el))
			arguments.push_back(new (ctx.get<SynCallArgument>()) SynCallArgument(el->begin, el->end, NULL, el));

		value = new (ctx.get<SynArrayIndex>()) SynArrayIndex(el->begin, el->end, value ? value : syntax->type, arguments);
	}

	return AnalyzeArrayIndex(ctx, value);
}